

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

float16 * MatrixToFloatV(Matrix mat)

{
  float16 *in_RDI;
  
  in_RDI->v[0xc] = 0.0;
  in_RDI->v[0xd] = 0.0;
  in_RDI->v[0xe] = 0.0;
  in_RDI->v[0xf] = 0.0;
  in_RDI->v[8] = 0.0;
  in_RDI->v[9] = 0.0;
  in_RDI->v[10] = 0.0;
  in_RDI->v[0xb] = 0.0;
  in_RDI->v[4] = 0.0;
  in_RDI->v[5] = 0.0;
  in_RDI->v[6] = 0.0;
  in_RDI->v[7] = 0.0;
  in_RDI->v[0] = 0.0;
  in_RDI->v[1] = 0.0;
  in_RDI->v[2] = 0.0;
  in_RDI->v[3] = 0.0;
  in_RDI->v[0] = mat.m0;
  in_RDI->v[1] = mat.m1;
  in_RDI->v[2] = mat.m2;
  in_RDI->v[3] = mat.m3;
  in_RDI->v[4] = mat.m4;
  in_RDI->v[5] = mat.m5;
  in_RDI->v[6] = mat.m6;
  in_RDI->v[7] = mat.m7;
  in_RDI->v[8] = mat.m8;
  in_RDI->v[9] = mat.m9;
  in_RDI->v[10] = mat.m10;
  in_RDI->v[0xb] = mat.m11;
  in_RDI->v[0xc] = mat.m12;
  in_RDI->v[0xd] = mat.m13;
  in_RDI->v[0xe] = mat.m14;
  in_RDI->v[0xf] = mat.m15;
  return in_RDI;
}

Assistant:

RMAPI float16 MatrixToFloatV(Matrix mat)
{
    float16 result = { 0 };

    result.v[0] = mat.m0;
    result.v[1] = mat.m1;
    result.v[2] = mat.m2;
    result.v[3] = mat.m3;
    result.v[4] = mat.m4;
    result.v[5] = mat.m5;
    result.v[6] = mat.m6;
    result.v[7] = mat.m7;
    result.v[8] = mat.m8;
    result.v[9] = mat.m9;
    result.v[10] = mat.m10;
    result.v[11] = mat.m11;
    result.v[12] = mat.m12;
    result.v[13] = mat.m13;
    result.v[14] = mat.m14;
    result.v[15] = mat.m15;

    return result;
}